

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O3

void __thiscall
slang::ast::builtins::DynArrayDeleteMethod::~DynArrayDeleteMethod(DynArrayDeleteMethod *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppTVar2;
  pointer pcVar3;
  
  (this->super_SimpleSystemSubroutine).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SimpleSystemSubroutine_0050fc10;
  ppTVar2 = (this->super_SimpleSystemSubroutine).argTypes.
            super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppTVar2 != (pointer)0x0) {
    operator_delete(ppTVar2,(long)(this->super_SimpleSystemSubroutine).argTypes.
                                  super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar2
                   );
  }
  (this->super_SimpleSystemSubroutine).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_0050fbb8;
  pcVar3 = (this->super_SimpleSystemSubroutine).super_SystemSubroutine.name._M_dataplus._M_p;
  paVar1 = &(this->super_SimpleSystemSubroutine).super_SystemSubroutine.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x68);
  return;
}

Assistant:

explicit DynArrayDeleteMethod(Compilation& comp) :
        SimpleSystemSubroutine("delete", SubroutineKind::Function, 0, {}, comp.getVoidType(), true,
                               /* isFirstArgLValue */ true) {}